

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O2

Maybe<capnp::Orphan<capnp::compiler::Declaration>_> * __thiscall
capnp::compiler::CapnpParser::parseStatement
          (Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *__return_storage_ptr__,
          CapnpParser *this,Reader statement,DeclParser *parser)

{
  Reader statement_00;
  byte *pbVar1;
  uint uVar2;
  bool bVar3;
  undefined4 uVar4;
  ulong uVar5;
  DeclParser *pDVar6;
  ErrorReporter *pEVar7;
  DeclParser *parser_00;
  size_t i;
  ulong uVar8;
  long lVar9;
  Reader value;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar10;
  Array<capnp::Orphan<capnp::compiler::Declaration>_> local_210;
  Reader memberStatements;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> local_1b8;
  NullableValue<capnp::Orphan<capnp::compiler::Declaration>_> member;
  Reader memberStatement;
  Vector<capnp::Orphan<capnp::compiler::Declaration>_> members;
  BuilderFor<capnp::compiler::Declaration> builder;
  NullableValue<capnp::compiler::CapnpParser::DeclParserResult> output;
  ParserInput parserInput;
  Reader tokens;
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  fullParser;
  
  fullParser.rest.first = (EndOfInput_ *)&kj::parse::endOfInput;
  fullParser.first = parser;
  Statement::Reader::getTokens(&tokens,&statement);
  parserInput.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  parserInput.pos.index = 0;
  parserInput.end.index = tokens.reader.elementCount;
  parserInput.best.index = 0;
  parserInput.pos.container = &tokens;
  parserInput.end.container = &tokens;
  parserInput.best.container = &tokens;
  kj::parse::
  Sequence_<const_kj::parse::ParserRef<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>,_capnp::compiler::CapnpParser::DeclParserResult>_&,_const_kj::parse::EndOfInput__&>
  ::
  parseNext<kj::parse::IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>_>
            ((Maybe<capnp::compiler::CapnpParser::DeclParserResult> *)&memberStatements,&fullParser,
             &parserInput);
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::NullableValue
            (&output,(NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)
                     &memberStatements);
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::~NullableValue
            ((NullableValue<capnp::compiler::CapnpParser::DeclParserResult> *)&memberStatements);
  if (output.isSet != true) {
    IVar10 = kj::parse::
             IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
             ::getBest(&parserInput);
    memberStatement._reader.segment = (SegmentReader *)IVar10.container;
    memberStatement._reader.capTable._0_4_ = IVar10.index;
    if ((uint)memberStatement._reader.capTable == tokens.reader.elementCount) {
      pbVar1 = (byte *)statement._reader.data;
      uVar2 = statement._reader.dataSize;
      if ((uint)memberStatement._reader.capTable == 0) goto joined_r0x001f5c62;
      builder._builder.capTable._0_4_ = (uint)memberStatement._reader.capTable - 1;
      builder._builder.segment = (SegmentBuilder *)&tokens;
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
      ::operator->((TemporaryPointer<capnp::compiler::Token::Reader> *)&memberStatements,
                   (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                    *)&builder);
      uVar8 = 0;
      if (0x9f < memberStatements.reader.structDataSize) {
        uVar8 = (ulong)*(uint *)(memberStatements.reader.ptr + 0x10);
      }
    }
    else {
      capnp::_::
      IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
      ::operator->((TemporaryPointer<capnp::compiler::Token::Reader> *)&memberStatements,
                   (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                    *)&memberStatement);
      pbVar1 = memberStatements.reader.ptr;
      uVar2 = memberStatements.reader.structDataSize;
joined_r0x001f5c62:
      uVar8 = 0;
      if (0x3f < uVar2) {
        uVar8 = (ulong)*(uint *)(pbVar1 + 4);
      }
    }
    (**this->errorReporter->_vptr_ErrorReporter)(this->errorReporter,uVar8,uVar8,"Parse error.",0xd)
    ;
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_001f5f86;
  }
  capnp::_::OrphanGetImpl<capnp::compiler::Declaration,_(capnp::Kind)3>::apply
            (&builder,(OrphanBuilder *)&output.field_1.value);
  bVar3 = Statement::Reader::hasDocComment(&statement);
  if (bVar3) {
    value = Statement::Reader::getDocComment(&statement);
    Declaration::Builder::setDocComment(&builder,value);
  }
  if (statement._reader.dataSize < 0x40) {
    *(undefined8 *)((long)builder._builder.data + 4) = 0;
    if (0xf < statement._reader.dataSize) {
      bVar3 = true;
      goto LAB_001f5ca0;
    }
    if (output.field_1.value.memberParser.ptr.isSet == true) {
      pEVar7 = this->errorReporter;
LAB_001f5bd8:
      uVar5 = 0;
      uVar8 = 0;
LAB_001f5f6b:
      (**pEVar7->_vptr_ErrorReporter)
                (pEVar7,uVar5,uVar8,"This statement should end with a block, not a semicolon.",0x39)
      ;
    }
  }
  else {
    *(undefined4 *)((long)builder._builder.data + 4) =
         *(undefined4 *)((long)statement._reader.data + 4);
    uVar4 = 0;
    bVar3 = statement._reader.dataSize < 0x60;
    if (!bVar3) {
      uVar4 = *(undefined4 *)((long)statement._reader.data + 8);
    }
    *(undefined4 *)((long)builder._builder.data + 8) = uVar4;
LAB_001f5ca0:
    if (*statement._reader.data == 1) {
      pDVar6 = (DeclParser *)0x0;
      parser_00 = (DeclParser *)&output.field_1.value.memberParser.ptr.field_1;
      if (output.field_1.value.memberParser.ptr.isSet == false) {
        parser_00 = pDVar6;
      }
      if (output.field_1.value.memberParser.ptr.isSet == true) {
        Statement::Reader::getBlock(&memberStatements,&statement);
        uVar8 = (ulong)memberStatements.reader.elementCount;
        members.builder.ptr =
             kj::_::HeapArrayDisposer::
             allocateUninitialized<capnp::Orphan<capnp::compiler::Declaration>>(uVar8);
        members.builder.endPtr = members.builder.ptr + uVar8;
        members.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
        local_210.ptr = (Orphan<capnp::compiler::Declaration> *)&memberStatements;
        members.builder.pos = members.builder.ptr;
        for (local_210.size_._0_4_ = 0;
            (uint)local_210.size_ != memberStatements.reader.elementCount;
            local_210.size_._0_4_ = (uint)local_210.size_ + 1) {
          capnp::_::
          IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
          ::operator*(&memberStatement,
                      (IndexingIterator<const_capnp::List<capnp::compiler::Statement,_(capnp::Kind)3>::Reader,_capnp::compiler::Statement::Reader>
                       *)&local_210);
          statement_00._reader.capTable._4_4_ = memberStatement._reader.capTable._4_4_;
          statement_00._reader.capTable._0_4_ = (uint)memberStatement._reader.capTable;
          statement_00._reader.segment = memberStatement._reader.segment;
          statement_00._reader.data = memberStatement._reader.data;
          statement_00._reader.pointers = memberStatement._reader.pointers;
          statement_00._reader.dataSize = memberStatement._reader.dataSize;
          statement_00._reader.pointerCount = memberStatement._reader.pointerCount;
          statement_00._reader._38_2_ = memberStatement._reader._38_2_;
          statement_00._reader.nestingLimit = memberStatement._reader.nestingLimit;
          statement_00._reader._44_4_ = memberStatement._reader._44_4_;
          parseStatement((Maybe<capnp::Orphan<capnp::compiler::Declaration>_> *)&local_1b8,this,
                         statement_00,parser_00);
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
                    (&member,&local_1b8);
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
                    (&local_1b8);
          if (member.isSet == true) {
            kj::Vector<capnp::Orphan<capnp::compiler::Declaration>>::
            add<capnp::Orphan<capnp::compiler::Declaration>>
                      ((Vector<capnp::Orphan<capnp::compiler::Declaration>> *)&members,
                       &member.field_1.value);
          }
          kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::~NullableValue
                    (&member);
        }
        kj::Vector<capnp::Orphan<capnp::compiler::Declaration>_>::releaseAsArray
                  (&local_210,&members);
        Orphanage::newOrphan<capnp::List<capnp::compiler::Declaration,(capnp::Kind)3>>
                  ((Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> *)&member,
                   &this->orphanage,(uint)local_210.size_);
        capnp::_::
        OrphanGetImpl<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>,_(capnp::Kind)6>::
        apply((Builder *)&memberStatement,(OrphanBuilder *)&member);
        lVar9 = 0;
        for (uVar8 = 0; uVar8 < CONCAT44(local_210.size_._4_4_,(uint)local_210.size_);
            uVar8 = uVar8 + 1) {
          List<capnp::compiler::Declaration,_(capnp::Kind)3>::Builder::adoptWithCaveats
                    ((Builder *)&memberStatement,(uint)uVar8,
                     (Orphan<capnp::compiler::Declaration> *)
                     ((long)&((ListReader *)&(local_210.ptr)->builder)->segment + lVar9));
          lVar9 = lVar9 + 0x20;
        }
        local_1b8.field_1.value.builder.tag.content = member.field_1.value.builder.tag.content;
        local_1b8.field_1.value.builder.segment = member.field_1.value.builder.segment;
        local_1b8.field_1.value.builder.capTable = member.field_1.value.builder.capTable;
        member.field_1.value.builder.tag.content = (word)0;
        member.field_1.value.builder.capTable = (CapTableBuilder *)0x0;
        capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&member);
        Declaration::Builder::adoptNestedDecls
                  (&builder,(Orphan<capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>_> *)
                            &local_1b8);
        capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&local_1b8);
        kj::Array<capnp::Orphan<capnp::compiler::Declaration>_>::~Array(&local_210);
        kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Declaration>_>::dispose(&members.builder);
      }
      else {
        if (0x3f < statement._reader.dataSize) {
          pDVar6 = (DeclParser *)(ulong)*(uint *)((long)statement._reader.data + 4);
        }
        uVar8 = 0;
        if (!bVar3) {
          uVar8 = (ulong)*(uint *)((long)statement._reader.data + 8);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,pDVar6,uVar8,
                   "This statement should end with a semicolon, not a block.",0x39);
      }
    }
    else if ((*statement._reader.data == 0) &&
            (output.field_1.value.memberParser.ptr.isSet != false)) {
      pEVar7 = this->errorReporter;
      if (statement._reader.dataSize < 0x40) {
        uVar5 = 0;
        if (bVar3) goto LAB_001f5bd8;
      }
      else {
        uVar5 = (ulong)*(uint *)((long)statement._reader.data + 4);
        uVar8 = 0;
        if (bVar3) goto LAB_001f5f6b;
      }
      uVar8 = (ulong)*(uint *)((long)statement._reader.data + 8);
      goto LAB_001f5f6b;
    }
  }
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Declaration>_>::NullableValue
            (&__return_storage_ptr__->ptr,&output.field_1.value.decl);
LAB_001f5f86:
  kj::_::NullableValue<capnp::compiler::CapnpParser::DeclParserResult>::~NullableValue(&output);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput(&parserInput);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Orphan<Declaration>> CapnpParser::parseStatement(
    Statement::Reader statement, const DeclParser& parser) {
  auto fullParser = p::sequence(parser, p::endOfInput);

  auto tokens = statement.getTokens();
  ParserInput parserInput(tokens.begin(), tokens.end());

  KJ_IF_MAYBE(output, fullParser(parserInput)) {
    auto builder = output->decl.get();

    if (statement.hasDocComment()) {
      builder.setDocComment(statement.getDocComment());
    }

    builder.setStartByte(statement.getStartByte());
    builder.setEndByte(statement.getEndByte());

    switch (statement.which()) {
      case Statement::LINE:
        if (output->memberParser != nullptr) {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a block, not a semicolon.");
        }
        break;

      case Statement::BLOCK:
        KJ_IF_MAYBE(memberParser, output->memberParser) {
          auto memberStatements = statement.getBlock();
          kj::Vector<Orphan<Declaration>> members(memberStatements.size());
          for (auto memberStatement: memberStatements) {
            KJ_IF_MAYBE(member, parseStatement(memberStatement, *memberParser)) {
              members.add(kj::mv(*member));
            }
          }
          builder.adoptNestedDecls(arrayToList(orphanage, members.releaseAsArray()));
        } else {
          errorReporter.addError(statement.getStartByte(), statement.getEndByte(),
              "This statement should end with a semicolon, not a block.");
        }
        break;
    }

    return kj::mv(output->decl);

  }